

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx512.cpp
# Opt level: O2

int __thiscall ncnn::LSTM_x86_avx512::create_pipeline(LSTM_x86_avx512 *this,Option *opt)

{
  long lVar1;
  long lVar2;
  _func_int **pp_Var3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  void *pvVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int *piVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  undefined4 *puVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  undefined4 *puVar34;
  ulong uVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  void *pvVar42;
  void *pvVar43;
  uint _c;
  uint uVar44;
  _func_int *p_Var45;
  int local_170;
  long local_150;
  long local_148;
  long local_128;
  long local_c8;
  
  p_Var45 = this->_vptr_LSTM_x86_avx512[-3];
  _c = (*(int *)(p_Var45 + 0x40 + (long)&(this->weight_hc_data_packed).data) == 2) + 1;
  iVar14 = *(int *)(p_Var45 + 0x44 + (long)&(this->weight_hc_data_packed).data);
  uVar30 = (long)((ulong)(uint)((int)((long)*(int *)(p_Var45 + 0x3c +
                                                    (long)&(this->weight_hc_data_packed).data) /
                                     (long)(int)_c) >> 0x1f) << 0x20 |
                 (long)*(int *)(p_Var45 + 0x3c + (long)&(this->weight_hc_data_packed).data) /
                 (long)(int)_c & 0xffffffffU) / (long)iVar14;
  uVar30 = (long)((ulong)(uint)((int)uVar30 >> 0x1f) << 0x20 | uVar30 & 0xffffffff) / 4;
  iVar29 = (int)uVar30;
  Mat::create(&this->weight_xc_data_packed,iVar29,iVar14 % 2 + iVar14 / 2,_c,0x20,8,(Allocator *)0x0
             );
  Mat::create(&this->bias_c_data_packed,
              *(int *)(this->_vptr_LSTM_x86_avx512[-3] + 0x44 +
                      (long)&(this->weight_hc_data_packed).data),1,_c,0x10,4,(Allocator *)0x0);
  iVar14 = *(int *)(this->_vptr_LSTM_x86_avx512[-3] + 0x44 +
                   (long)&(this->weight_hc_data_packed).data);
  Mat::create(&this->weight_hc_data_packed,
              *(int *)(this->_vptr_LSTM_x86_avx512[-3] + 0x38 +
                      (long)&(this->weight_hc_data_packed).data),iVar14 % 2 + iVar14 / 2,_c,0x20,8,
              (Allocator *)0x0);
  pp_Var3 = this->_vptr_LSTM_x86_avx512;
  pvVar43 = (this->weight_xc_data_packed).data;
  sVar4 = (this->weight_xc_data_packed).elemsize;
  pvVar5 = (this->bias_c_data_packed).data;
  sVar6 = (this->bias_c_data_packed).cstep;
  sVar7 = (this->bias_c_data_packed).elemsize;
  pvVar8 = (this->weight_hc_data_packed).data;
  sVar9 = (this->weight_hc_data_packed).elemsize;
  lVar37 = (this->weight_hc_data_packed).cstep * sVar9;
  lVar24 = (long)(this->weight_hc_data_packed).w * sVar9;
  uVar27 = 0;
  uVar30 = uVar30 & 0xffffffff;
  if (iVar29 < 1) {
    uVar30 = uVar27;
  }
  lVar21 = (this->weight_xc_data_packed).cstep * sVar4;
  lVar40 = (long)(this->weight_xc_data_packed).w * sVar4;
  local_128 = (long)pvVar43 + 8;
  local_148 = (long)pvVar8 + 8;
  for (; uVar27 != _c; uVar27 = uVar27 + 1) {
    p_Var45 = pp_Var3[-3];
    lVar33 = (long)*(int *)(&this->field_0x154 + (long)p_Var45);
    lVar10 = *(long *)(&this->field_0x138 + (long)p_Var45);
    lVar38 = *(long *)(&this->field_0x1b0 + (long)p_Var45) * uVar27 *
             *(long *)(&this->field_0x180 + (long)p_Var45) +
             *(long *)(&this->field_0x170 + (long)p_Var45);
    lVar41 = (long)*(int *)(&this->field_0x10c + (long)p_Var45);
    lVar11 = *(long *)(&this->field_0xf0 + (long)p_Var45);
    puVar28 = (undefined4 *)(sVar6 * sVar7 * uVar27 + (long)pvVar5);
    lVar15 = (long)*(int *)(&this->field_0x19c + (long)p_Var45) *
             *(long *)(&this->field_0x180 + (long)p_Var45);
    lVar1 = lVar38 + lVar15;
    lVar2 = lVar38 + lVar15 * 2;
    lVar16 = lVar15 * 3 + lVar38;
    lVar31 = *(long *)(&this->field_0x168 + (long)p_Var45) * uVar27;
    lVar15 = *(long *)(&this->field_0x128 + (long)p_Var45);
    local_150 = (lVar33 + lVar31) * lVar10 + lVar15;
    lVar32 = lVar31 * lVar10 + lVar15;
    lVar22 = *(long *)(&this->field_0x120 + (long)p_Var45) * uVar27;
    lVar12 = *(long *)(&this->field_0xe0 + (long)p_Var45);
    local_c8 = (lVar22 + lVar41) * lVar11 + lVar12;
    lVar23 = lVar22 * lVar11 + lVar12;
    lVar20 = lVar10 * lVar33 * 2;
    lVar36 = lVar11 * lVar41 * 2;
    uVar39 = 0;
    iVar14 = 1;
    uVar35 = 0;
    pvVar42 = pvVar43;
    while( true ) {
      uVar17 = uVar35 | 1;
      uVar25 = (ulong)*(int *)(p_Var45 + 0x44 + (long)&(this->weight_hc_data_packed).data);
      if ((long)uVar25 <= (long)uVar17) break;
      *puVar28 = *(undefined4 *)(lVar38 + uVar35 * 4);
      puVar28[1] = *(undefined4 *)(lVar1 + uVar35 * 4);
      puVar28[2] = *(undefined4 *)(lVar2 + uVar35 * 4);
      puVar28[3] = *(undefined4 *)(lVar16 + uVar35 * 4);
      puVar28[4] = *(undefined4 *)(lVar38 + uVar17 * 4);
      puVar28[5] = *(undefined4 *)(lVar1 + uVar17 * 4);
      puVar28[6] = *(undefined4 *)(lVar2 + uVar17 * 4);
      puVar28[7] = *(undefined4 *)(lVar16 + uVar17 * 4);
      iVar29 = *(int *)(pp_Var3[-3] + 0x44 + (long)&(this->weight_hc_data_packed).data);
      lVar18 = (long)(iVar14 + iVar29 * 3);
      local_170 = (int)uVar35;
      lVar26 = (long)(iVar29 * 3 + local_170);
      for (lVar19 = 0; uVar30 << 2 != lVar19; lVar19 = lVar19 + 4) {
        *(undefined4 *)((long)pvVar42 + lVar19 * 8) = *(undefined4 *)(lVar32 + lVar19);
        *(undefined4 *)((long)pvVar42 + lVar19 * 8 + 4) =
             *(undefined4 *)((lVar33 * (iVar29 + local_170) + lVar31) * lVar10 + lVar15 + lVar19);
        *(undefined4 *)((long)pvVar42 + lVar19 * 8 + 8) =
             *(undefined4 *)
              (((local_170 + iVar29 * 2) * lVar33 + lVar31) * lVar10 + lVar15 + lVar19);
        *(undefined4 *)((long)pvVar42 + lVar19 * 8 + 0xc) =
             *(undefined4 *)((lVar33 * lVar26 + lVar31) * lVar10 + lVar15 + lVar19);
        *(undefined4 *)((long)pvVar42 + lVar19 * 8 + 0x10) = *(undefined4 *)(local_150 + lVar19);
        *(undefined4 *)((long)pvVar42 + lVar19 * 8 + 0x14) =
             *(undefined4 *)((lVar33 * (iVar29 + iVar14) + lVar31) * lVar10 + lVar15 + lVar19);
        *(undefined4 *)((long)pvVar42 + lVar19 * 8 + 0x18) =
             *(undefined4 *)(((iVar14 + iVar29 * 2) * lVar33 + lVar31) * lVar10 + lVar15 + lVar19);
        *(undefined4 *)((long)pvVar42 + lVar19 * 8 + 0x1c) =
             *(undefined4 *)((lVar33 * lVar18 + lVar31) * lVar10 + lVar15 + lVar19);
      }
      puVar34 = (undefined4 *)((long)pvVar8 + (uVar35 >> 1) * lVar24 + lVar37 * uVar27);
      for (lVar19 = 0; p_Var45 = pp_Var3[-3],
          lVar19 < *(int *)(p_Var45 + 0x38 + (long)&(this->weight_hc_data_packed).data);
          lVar19 = lVar19 + 1) {
        *puVar34 = *(undefined4 *)(lVar23 + lVar19 * 4);
        puVar34[1] = *(undefined4 *)
                      (((iVar29 + local_170) * lVar41 + lVar22) * lVar11 + lVar12 + lVar19 * 4);
        puVar34[2] = *(undefined4 *)
                      (((iVar29 * 2 + local_170) * lVar41 + lVar22) * lVar11 + lVar12 + lVar19 * 4);
        puVar34[3] = *(undefined4 *)((lVar26 * lVar41 + lVar22) * lVar11 + lVar12 + lVar19 * 4);
        puVar34[4] = *(undefined4 *)(local_c8 + lVar19 * 4);
        puVar34[5] = *(undefined4 *)
                      (((iVar29 + iVar14) * lVar41 + lVar22) * lVar11 + lVar12 + lVar19 * 4);
        puVar34[6] = *(undefined4 *)
                      (((iVar14 + iVar29 * 2) * lVar41 + lVar22) * lVar11 + lVar12 + lVar19 * 4);
        puVar34[7] = *(undefined4 *)((lVar18 * lVar41 + lVar22) * lVar11 + lVar12 + lVar19 * 4);
        puVar34 = puVar34 + 8;
      }
      puVar28 = puVar28 + 8;
      uVar35 = uVar35 + 2;
      iVar14 = iVar14 + 2;
      local_150 = local_150 + lVar20;
      lVar32 = lVar32 + lVar20;
      pvVar42 = (void *)((long)pvVar42 + lVar40);
      local_c8 = local_c8 + lVar36;
      lVar23 = lVar23 + lVar36;
      uVar39 = (ulong)((int)uVar39 + 2);
    }
    for (; (long)uVar35 < (long)(int)uVar25; uVar35 = uVar35 + 1) {
      uVar44 = (uint)uVar39;
      uVar39 = (ulong)((uVar44 & 1) + (int)(uVar39 >> 1));
      puVar34 = (undefined4 *)(lVar24 * uVar39 + local_148);
      lVar18 = uVar39 * lVar40 + local_128;
      *puVar28 = *(undefined4 *)(lVar38 + uVar35 * 4);
      puVar28[1] = *(undefined4 *)(lVar1 + uVar35 * 4);
      puVar28[2] = *(undefined4 *)(lVar2 + uVar35 * 4);
      puVar28[3] = *(undefined4 *)(lVar16 + uVar35 * 4);
      iVar14 = *(int *)(pp_Var3[-3] + 0x44 + (long)&(this->weight_hc_data_packed).data);
      lVar36 = (long)(int)(iVar14 * 3 + uVar44);
      for (lVar20 = 0; uVar30 << 2 != lVar20; lVar20 = lVar20 + 4) {
        *(undefined4 *)(lVar18 + -8 + lVar20 * 4) = *(undefined4 *)(lVar32 + lVar20);
        *(undefined4 *)(lVar18 + -4 + lVar20 * 4) =
             *(undefined4 *)((lVar33 * (int)(iVar14 + uVar44) + lVar31) * lVar10 + lVar15 + lVar20);
        *(undefined4 *)(lVar18 + lVar20 * 4) =
             *(undefined4 *)
              (((int)(uVar44 + iVar14 * 2) * lVar33 + lVar31) * lVar10 + lVar15 + lVar20);
        *(undefined4 *)(lVar18 + 4 + lVar20 * 4) =
             *(undefined4 *)((lVar33 * lVar36 + lVar31) * lVar10 + lVar15 + lVar20);
      }
      for (lVar20 = 0;
          lVar20 < *(int *)(pp_Var3[-3] + 0x38 + (long)&(this->weight_hc_data_packed).data);
          lVar20 = lVar20 + 1) {
        puVar34[-2] = *(undefined4 *)(lVar23 + lVar20 * 4);
        puVar34[-1] = *(undefined4 *)
                       (((int)(iVar14 + uVar44) * lVar41 + lVar22) * lVar11 + lVar12 + lVar20 * 4);
        *puVar34 = *(undefined4 *)
                    (((int)(iVar14 * 2 + uVar44) * lVar41 + lVar22) * lVar11 + lVar12 + lVar20 * 4);
        puVar34[1] = *(undefined4 *)((lVar36 * lVar41 + lVar22) * lVar11 + lVar12 + lVar20 * 4);
        puVar34 = puVar34 + 4;
      }
      puVar28 = puVar28 + 4;
      uVar25 = (ulong)*(uint *)(pp_Var3[-3] + 0x44 + (long)&(this->weight_hc_data_packed).data);
      uVar39 = (ulong)(uVar44 + 1);
      lVar32 = lVar32 + lVar10 * lVar33;
      lVar23 = lVar23 + lVar11 * lVar41;
    }
    pvVar43 = (void *)((long)pvVar43 + lVar21);
    local_128 = local_128 + lVar21;
    local_148 = local_148 + lVar37;
  }
  if (opt->lightmode != false) {
    p_Var45 = pp_Var3[-3];
    piVar13 = *(int **)(&this->field_0x130 + (long)p_Var45);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (*(long **)(&this->field_0x148 + (long)p_Var45) == (long *)0x0) {
          free(*(void **)(&this->field_0x128 + (long)p_Var45));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x148 + (long)p_Var45) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x168 + (long)p_Var45) = 0;
    *(undefined8 *)(&this->field_0x134 + (long)p_Var45) = 0;
    *(undefined8 *)(&this->field_0x13c + (long)p_Var45) = 0;
    *(undefined8 *)(&this->field_0x128 + (long)p_Var45) = 0;
    *(undefined8 *)(&this->field_0x130 + (long)p_Var45) = 0;
    *(undefined4 *)(&this->field_0x160 + (long)p_Var45) = 0;
    *(undefined8 *)(&this->field_0x150 + (long)p_Var45) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var45) = 0;
    p_Var45 = this->_vptr_LSTM_x86_avx512[-3];
    piVar13 = *(int **)(&this->field_0x178 + (long)p_Var45);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (*(long **)(&this->field_0x190 + (long)p_Var45) == (long *)0x0) {
          free(*(void **)(&this->field_0x170 + (long)p_Var45));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x190 + (long)p_Var45) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1b0 + (long)p_Var45) = 0;
    *(undefined8 *)(&this->field_0x17c + (long)p_Var45) = 0;
    *(undefined8 *)(&this->field_0x184 + (long)p_Var45) = 0;
    *(undefined8 *)(&this->field_0x170 + (long)p_Var45) = 0;
    *(undefined8 *)(&this->field_0x178 + (long)p_Var45) = 0;
    *(undefined4 *)(&this->field_0x1a8 + (long)p_Var45) = 0;
    *(undefined8 *)(&this->field_0x198 + (long)p_Var45) = 0;
    *(undefined8 *)(&this->field_0x1a0 + (long)p_Var45) = 0;
    p_Var45 = this->_vptr_LSTM_x86_avx512[-3];
    piVar13 = *(int **)(&this->field_0xe8 + (long)p_Var45);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (*(long **)(&this->field_0x100 + (long)p_Var45) == (long *)0x0) {
          free(*(void **)(&this->field_0xe0 + (long)p_Var45));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x100 + (long)p_Var45) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x120 + (long)p_Var45) = 0;
    *(undefined8 *)(&this->field_0xec + (long)p_Var45) = 0;
    *(undefined8 *)(&this->field_0xf4 + (long)p_Var45) = 0;
    *(undefined8 *)(&this->field_0xe0 + (long)p_Var45) = 0;
    *(undefined8 *)(&this->field_0xe8 + (long)p_Var45) = 0;
    *(undefined8 *)(&this->field_0x108 + (long)p_Var45) = 0;
    *(undefined8 *)(&this->field_0x110 + (long)p_Var45) = 0;
    *(undefined4 *)(&this->field_0x118 + (long)p_Var45) = 0;
  }
  return 0;
}

Assistant:

int LSTM_x86_avx512::create_pipeline(const Option& opt)
{
    // pack IFOG
    int num_directions = direction == 2 ? 2 : 1;
    int size = weight_data_size / num_directions / hidden_size / 4;

#if __AVX__
    weight_xc_data_packed.create(size, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
#else
    weight_xc_data_packed.create(size, hidden_size, num_directions, 16u, 4);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size, num_directions, 16u, 4);
#endif

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int dr = 0; dr < num_directions; dr++)
    {
        const Mat weight_xc = weight_xc_data.channel(dr);
        const Mat bias_c = bias_c_data.channel(dr);
        const Mat weight_hc = weight_hc_data.channel(dr);

        Mat weight_xc_data_packed_dr = weight_xc_data_packed.channel(dr);
        Mat bias_c_data_packed_dr = bias_c_data_packed.channel(dr);
        Mat weight_hc_data_packed_dr = weight_hc_data_packed.channel(dr);

        const float* bias_c_I = bias_c.row(0);
        const float* bias_c_F = bias_c.row(1);
        const float* bias_c_O = bias_c.row(2);
        const float* bias_c_G = bias_c.row(3);

        float* bias_c_IFOG = bias_c_data_packed_dr.row(0);

        int q = 0;
#if __AVX__
        for (; q + 1 < hidden_size; q += 2)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];
            bias_c_IFOG[4] = bias_c_I[q + 1];
            bias_c_IFOG[5] = bias_c_F[q + 1];
            bias_c_IFOG[6] = bias_c_O[q + 1];
            bias_c_IFOG[7] = bias_c_G[q + 1];

            bias_c_IFOG += 8;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);
            const float* weight_xc_I_1 = weight_xc.row(hidden_size * 0 + q + 1);
            const float* weight_xc_F_1 = weight_xc.row(hidden_size * 1 + q + 1);
            const float* weight_xc_O_1 = weight_xc.row(hidden_size * 2 + q + 1);
            const float* weight_xc_G_1 = weight_xc.row(hidden_size * 3 + q + 1);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);
            const float* weight_hc_I_1 = weight_hc.row(hidden_size * 0 + q + 1);
            const float* weight_hc_F_1 = weight_hc.row(hidden_size * 1 + q + 1);
            const float* weight_hc_O_1 = weight_hc.row(hidden_size * 2 + q + 1);
            const float* weight_hc_G_1 = weight_hc.row(hidden_size * 3 + q + 1);

            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2);

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];
                weight_xc_IFOG[4] = weight_xc_I_1[i];
                weight_xc_IFOG[5] = weight_xc_F_1[i];
                weight_xc_IFOG[6] = weight_xc_O_1[i];
                weight_xc_IFOG[7] = weight_xc_G_1[i];

                weight_xc_IFOG += 8;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];
                weight_hc_IFOG[4] = weight_hc_I_1[i];
                weight_hc_IFOG[5] = weight_hc_F_1[i];
                weight_hc_IFOG[6] = weight_hc_O_1[i];
                weight_hc_IFOG[7] = weight_hc_G_1[i];

                weight_hc_IFOG += 8;
            }
        }
#endif // __AVX__
        for (; q < hidden_size; q++)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];

            bias_c_IFOG += 4;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);

#if __AVX__
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2 + q % 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2 + q % 2);
#else
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q);
#endif

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];

                weight_xc_IFOG += 4;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];

                weight_hc_IFOG += 4;
            }
        }
    }

    if (opt.lightmode)
    {
        weight_xc_data.release();
        bias_c_data.release();
        weight_hc_data.release();
    }

    return 0;
}